

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcmalloc_unittest.cc
# Opt level: O3

void __thiscall TesterThread::UpdateObject(TesterThread *this)

{
  int *piVar1;
  pointer pOVar2;
  pointer pOVar3;
  long lVar4;
  int iVar5;
  
  pOVar2 = (this->heap_).
           super__Vector_base<TesterThread::Object,_std::allocator<TesterThread::Object>_>._M_impl.
           super__Vector_impl_data._M_start;
  pOVar3 = (this->heap_).
           super__Vector_base<TesterThread::Object,_std::allocator<TesterThread::Object>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pOVar2 != pOVar3) {
    lVar4 = random();
    iVar5 = (int)((ulong)((long)pOVar3 - (long)pOVar2) >> 4);
    if (iVar5 == 0) {
      lVar4 = 0;
    }
    else {
      lVar4 = lVar4 % (long)iVar5;
    }
    CheckContents(this,(this->heap_).
                       super__Vector_base<TesterThread::Object,_std::allocator<TesterThread::Object>_>
                       ._M_impl.super__Vector_impl_data._M_start + lVar4);
    pOVar2 = (this->heap_).
             super__Vector_base<TesterThread::Object,_std::allocator<TesterThread::Object>_>._M_impl
             .super__Vector_impl_data._M_start;
    piVar1 = &pOVar2[lVar4].generation;
    *piVar1 = *piVar1 + 1;
    FillContents(this,pOVar2 + lVar4);
    return;
  }
  return;
}

Assistant:

void UpdateObject() {
    if (heap_.empty()) return;
    const int index = rnd_.Uniform(heap_.size());
    CheckContents(heap_[index]);
    heap_[index].generation++;
    FillContents(&heap_[index]);
  }